

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

int SDL_CDEject(SDL12_CD *cdrom)

{
  AudioCallbackWrapperData *pAVar1;
  int iVar2;
  SDL12_CD *pSVar3;
  
  pSVar3 = ValidCDDevice(cdrom);
  if (pSVar3 == (SDL12_CD *)0x0) {
    iVar2 = -1;
  }
  else {
    (*SDL20_LockAudio)();
    pAVar1 = audio_cbdata;
    if (audio_cbdata != (AudioCallbackWrapperData *)0x0) {
      audio_cbdata->cdrom_status = SDL12_CD_TRAYEMPTY;
      FreeMp3(&pAVar1->cdrom_mp3);
    }
    pSVar3->status = SDL12_CD_TRAYEMPTY;
    (*SDL20_UnlockAudio)();
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

SDLCALL
SDL_CDEject(SDL12_CD *cdrom)
{
    if ((cdrom = ValidCDDevice(cdrom)) == NULL) {
        return -1;
    }

    SDL20_LockAudio();
    if (audio_cbdata) {
        audio_cbdata->cdrom_status = SDL12_CD_TRAYEMPTY;
        FreeMp3(&audio_cbdata->cdrom_mp3);
    }
    cdrom->status = SDL12_CD_TRAYEMPTY;
    SDL20_UnlockAudio();
    return 0;
}